

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
DeleteProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
               *this,DynamicObject *instance,JavascriptString *propertyNameString,
              PropertyOperationFlags propertyOperationFlags)

{
  Type *pTVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  ScriptContext *this_01;
  DynamicObject *pDVar4;
  bool bVar5;
  charcount_t cVar6;
  uint uVar7;
  int iVar8;
  PropertyId propertyId;
  BOOL BVar9;
  char16 *pcVar10;
  undefined4 *puVar11;
  undefined4 extraout_var;
  RecyclableObject *pRVar12;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_02;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar13;
  byte bVar14;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  CharacterBuffer<char16_t> local_60;
  RecyclableObject *local_50;
  ScriptContext *local_48;
  DynamicObject *local_40;
  PropertyOperationFlags local_34;
  
  local_40 = instance;
  local_34 = propertyOperationFlags;
  while( true ) {
    pcVar10 = JavascriptString::GetString(propertyNameString);
    cVar6 = JavascriptString::GetLength(propertyNameString);
    bVar5 = PropertyRecord::IsPropertyNameNumeric(pcVar10,cVar6);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x617,
                                  "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                  ,
                                  "Numeric property names should have been converted to uint or PropertyRecord* "
                                 );
      if (!bVar5) goto LAB_00de449b;
      *puVar11 = 0;
    }
    pDVar4 = local_40;
    bVar14 = (this->super_DynamicTypeHandler).flags;
    if ((bVar14 & 4) == 0) break;
    this = ConvertToNonSharedSimpleDictionaryType(this,local_40);
  }
  if ((DAT_015d633c == '\x01') && ((this->field_0x28 & 6) == 0)) {
    pSVar13 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>
                         ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                           *)this,local_40)->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>;
    BVar9 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            DeleteProperty(pSVar13,pDVar4,propertyNameString,local_34);
    return BVar9;
  }
  pTVar1 = (local_40->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar14 & 0x10) != 0) || (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x627,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar5) goto LAB_00de449b;
      *puVar11 = 0;
    }
    DynamicObject::ChangeType(pDVar4);
  }
  local_48 = (((((pDVar4->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  pcVar10 = JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60.string.ptr = pcVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  this_00 = (this->propertyMap).ptr;
  local_60.len = cVar6;
  uVar7 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_60);
  if (-1 < (int)uVar7) {
    descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                 ((this_00->entries).ptr + uVar7);
    bVar14 = descriptor->Attributes;
    if ((bVar14 & 8) != 0) {
      return 1;
    }
    if ((bVar14 & 2) == 0) {
      pcVar10 = JavascriptString::GetString(propertyNameString);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(local_34,local_48,pcVar10);
      return 0;
    }
    if ((bVar14 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x643,"(!(descriptor->Attributes & 0x10))",
                                  "!(descriptor->Attributes & PropertyLetConstGlobal)");
      if (!bVar5) goto LAB_00de449b;
      *puVar11 = 0;
    }
    if (descriptor->propertyIndex != 0xffff) {
      local_50 = (((local_48->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      if (local_48 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x199,"(scriptContext)","scriptContext");
        if (!bVar5) goto LAB_00de449b;
        *puVar11 = 0;
      }
      pDVar4 = local_40;
      iVar8 = DAT_015d6338;
      if ((0 < DAT_015d6338 && (this->field_0x28 & 2) == 0) &&
         (bVar14 = this->numDeletedProperties + 1, this->numDeletedProperties = bVar14,
         iVar8 <= (int)(uint)bVar14)) {
        if (((this->field_0x28 & 4) == 0) &&
           (pRVar12 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                (&local_40->super_RecyclableObject,(RecyclableObject **)0x0),
           pRVar12 == (RecyclableObject *)0x0)) {
          bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,TypeHandlerTransitionPhase);
          if (bVar5) {
            Output::Print(L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n");
            Output::Flush();
          }
          pSVar13 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                     ::
                     ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,false>
                               ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                                 *)this,pDVar4)->
                     super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
          ;
          BVar9 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
                  DeleteProperty(pSVar13,pDVar4,propertyNameString,local_34);
          return BVar9;
        }
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,TypeHandlerTransitionPhase);
        if (bVar5) {
          Output::Print(
                       L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                       );
          Output::Flush();
        }
        this_02 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
                   ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,false>
                             ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                               *)this,pDVar4)->
                   super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
        ;
        BVar9 = DeleteProperty(this_02,pDVar4,propertyNameString,local_34);
        return BVar9;
      }
      pRVar2 = (this->singletonInstance).ptr;
      if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
         ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != local_40)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x66f,
                                    "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                    ,
                                    "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                   );
        if (!bVar5) {
LAB_00de449b:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
                 this,propertyNameString,descriptor,
                 (((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        iVar8 = (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])
                          (propertyNameString);
        cVar6 = JavascriptString::GetLength(propertyNameString);
        this_01 = local_48;
        propertyId = ScriptContext::GetOrAddPropertyIdTracked
                               (local_48,(LPCWSTR)CONCAT44(extraout_var,iVar8),cVar6);
        ScriptContext::InvalidateProtoCaches(this_01,propertyId);
      }
      if (((this->field_0x28 & 2) == 0) ||
         (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                  ::TryRegisterDeletedPropertyIndex
                            ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                              *)this,local_40,descriptor->propertyIndex), !bVar5)) {
        DynamicTypeHandler::SetSlotUnchecked(local_40,(uint)descriptor->propertyIndex,local_50);
      }
    }
    pDVar4 = local_40;
    descriptor->Attributes = '\x0e';
    if ((char)((local_40->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(local_40);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar4,&local_60,(Var)0x0,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty(DynamicObject* instance, JavascriptString* propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        if (!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();

            JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyName, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyNameString->GetString()); // or propertyName->GetBuffer

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyNameString, descriptor, instance->GetScriptContext());
#endif
                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetSz(), propertyNameString->GetLength()));
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if (!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
        }
        return true;
    }